

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O1

void __thiscall tcu::ThreadUtil::Thread::pushMessage(Thread *this,string *str)

{
  ScopedLock lock;
  allocator<char> local_41;
  Mutex *local_40;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  local_40 = &this->m_messageLock;
  deMutex_lock((this->m_messageLock).m_mutex);
  local_38 = (undefined1  [8])deGetMicroseconds();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,(str->_M_dataplus)._M_p,&local_41);
  std::vector<tcu::ThreadUtil::Message,_std::allocator<tcu::ThreadUtil::Message>_>::
  emplace_back<tcu::ThreadUtil::Message>(&this->m_messages,(Message *)local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_p != &local_20) {
    operator_delete(local_30._M_p,local_20._M_allocated_capacity + 1);
  }
  deMutex_unlock(local_40->m_mutex);
  return;
}

Assistant:

void Thread::pushMessage (const std::string& str)
{
	de::ScopedLock lock(m_messageLock);
	m_messages.push_back(Message(deGetMicroseconds(), str.c_str()));
}